

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void arena_dalloc_small(tsdn_t *tsdn,void *ptr)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  arena_t *arena;
  bin_t *pbVar5;
  ulong uVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  rtree_leaf_elm_t *prVar10;
  ticker_t *ptVar11;
  ulong uVar12;
  long lVar13;
  extent_t *slab;
  rtree_ctx_t *ctx;
  rtree_ctx_t rtree_ctx_fallback;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar9 = (ulong)ptr & 0xffffffffc0000000;
  uVar12 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar12);
  uVar12 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar12);
  if (uVar12 == uVar9) {
    prVar10 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar9) {
    prVar10 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar12;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar9;
    puVar1[1] = (ulong)prVar10;
    prVar10 = (rtree_leaf_elm_t *)
              ((long)&(prVar10->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    for (lVar13 = 0x118; lVar13 != 0x188; lVar13 = lVar13 + 0x10) {
      if (*(ulong *)((long)ctx->cache + lVar13 + -8) == uVar9) {
        uVar6 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar13);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar13 + -0x18);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar13 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        *(ulong *)((long)ctx->cache + lVar13 + -0x18) = uVar12;
        *(ulong *)((long)(ctx->cache + -1) + lVar13) = puVar1[1];
        *puVar1 = uVar9;
        puVar1[1] = uVar6;
        prVar10 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar6);
        goto LAB_00110194;
      }
    }
    prVar10 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,ctx,(uintptr_t)ptr,true,false);
  }
LAB_00110194:
  slab = (extent_t *)(((long)(prVar10->le_bits).repr << 0x10) >> 0x10 & 0xfffffffffffffffe);
  arena = (arena_t *)arenas[(uint)slab->e_bits & 0xfff].repr;
  uVar12 = slab->e_bits >> 0x12 & 0xff;
  uVar8 = (uint)(slab->e_bits >> 0x24) & 0x3f;
  pbVar5 = arena->bins[uVar12].bin_shards;
  malloc_mutex_lock(tsdn,&pbVar5[uVar8].lock);
  arena_dalloc_bin_locked_impl(tsdn,arena,pbVar5 + uVar8,(szind_t)uVar12,slab,ptr,false);
  pbVar5[uVar8].lock.field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&pbVar5[uVar8].lock.field_0 + 0x40));
  if (tsdn != (tsdn_t *)0x0) {
    ptVar11 = decay_ticker_get(&tsdn->tsd,arena->base->ind);
    if ((ptVar11 != (ticker_t *)0x0) &&
       (iVar4 = ptVar11->tick, ptVar11->tick = iVar4 + -1, iVar4 < 1)) {
      ptVar11->tick = ptVar11->nticks;
      arena_decay(tsdn,arena,false,false);
    }
  }
  return;
}

Assistant:

void
arena_dalloc_small(tsdn_t *tsdn, void *ptr) {
	extent_t *extent = iealloc(tsdn, ptr);
	arena_t *arena = extent_arena_get(extent);

	arena_dalloc_bin(tsdn, arena, extent, ptr);
	arena_decay_tick(tsdn, arena);
}